

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O2

void GenCodeCmdItol(CodeGenRegVmContext *ctx,RegVmCmd cmd)

{
  EMIT_OP_REG_RPTR(&ctx->ctx,o_movsxd,rEAX,sDWORD,rEBX,(uint)((ulong)cmd >> 0x15) & 0x7f8);
  EMIT_OP_RPTR_REG(&ctx->ctx,o_mov64,sQWORD,rEBX,cmd._0_4_ >> 5 & 0x7f8,rEAX);
  return;
}

Assistant:

void GenCodeCmdItol(CodeGenRegVmContext &ctx, RegVmCmd cmd)
{
#if defined(_M_X64)
	EMIT_OP_REG_RPTR(ctx.ctx, o_movsxd, rRAX, sDWORD, rREG, cmd.rC * 8); // Load int as long with sign extension
	EMIT_OP_RPTR_REG(ctx.ctx, o_mov64, sQWORD, rREG, cmd.rA * 8, rRAX); // Store value
#else
	EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, cmd.rC * 8); // Load int
	EMIT_OP(ctx.ctx, o_cdq);

	EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, cmd.rA * 8, rEAX); // Store value
	EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, cmd.rA * 8 + 4, rEDX); // Store value
#endif
}